

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_file.c
# Opt level: O2

_Bool internal_file_read(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_fiber_t *fiber;
  char *s;
  undefined6 in_register_00000012;
  _Bool _Var1;
  gravity_value_t value;
  gravity_value_t value_00;
  size_t len;
  size_t local_1018;
  char acStack_1010 [4088];
  
  if (((int)CONCAT62(in_register_00000012,nargs) == 2) || (args[1].isa == gravity_class_string)) {
    local_1018 = 0;
    s = file_read((char *)(args[1].field_1.p)->objclass,&local_1018);
    if (s == (char *)0x0) {
      value_00.field_1.n = 0;
      value_00.isa = gravity_class_null;
    }
    else {
      value_00 = gravity_string_to_value(vm,s,(uint32_t)local_1018);
    }
    gravity_vm_setslot(vm,value_00,rindex);
    _Var1 = true;
  }
  else {
    builtin_strncpy(acStack_1010 + 0x18,"is required.",0xd);
    builtin_strncpy(acStack_1010 + 8," of type String ",0x10);
    local_1018._0_1_ = 'A';
    local_1018._1_1_ = ' ';
    local_1018._2_1_ = 'p';
    local_1018._3_1_ = 'a';
    local_1018._4_1_ = 't';
    local_1018._5_1_ = 'h';
    local_1018._6_1_ = ' ';
    local_1018._7_1_ = 'p';
    builtin_strncpy(acStack_1010,"arameter",8);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,(char *)&local_1018);
    _Var1 = false;
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,rindex);
  }
  return _Var1;
}

Assistant:

static bool internal_file_read (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // 1 parameter of type string is required
    if (nargs != 2 && !VALUE_ISA_STRING(args[1])) {
        RETURN_ERROR("A path parameter of type String is required.");
    }
    
    char *path = VALUE_AS_STRING(args[1])->s;
    size_t len = 0;
    char *buffer = file_read((const char *)path, &len);
    if (!buffer) {
        RETURN_VALUE(VALUE_FROM_NULL, rindex);
    }
    
    gravity_value_t string = VALUE_FROM_STRING(vm, buffer, (uint32_t)len);
    RETURN_VALUE(string, rindex);
}